

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O1

void classdef_free(classdef_t *classdef)

{
  long lVar1;
  
  if (0 < classdef->n_words) {
    lVar1 = 0;
    do {
      ckd_free(classdef->words[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < classdef->n_words);
  }
  ckd_free(classdef->words);
  ckd_free(classdef->weights);
  ckd_free(classdef);
  return;
}

Assistant:

void
classdef_free(classdef_t * classdef)
{
    int32 i;
    for (i = 0; i < classdef->n_words; ++i)
        ckd_free(classdef->words[i]);
    ckd_free(classdef->words);
    ckd_free(classdef->weights);
    ckd_free(classdef);
}